

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9PoPart(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  uint local_4c;
  uint local_48;
  int fVerbose;
  int fSetLargest;
  int fOnlyCis;
  int SelectShift;
  int c;
  Vec_Ptr_t *vPosEquivs;
  Gia_Man_t *pTemp;
  char **argv_local;
  Abc_Frame_t *pAStack_18;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  _SelectShift = (Vec_Ptr_t *)0x0;
  fSetLargest = 0;
  fVerbose = 0;
  local_48 = 0;
  local_4c = 0;
  pTemp = (Gia_Man_t *)argv;
  argv_local._4_4_ = argc;
  pAStack_18 = pAbc;
  Extra_UtilGetoptReset();
  do {
    iVar1 = Extra_UtilGetopt(argv_local._4_4_,&pTemp->pName,"Simvh");
    if (iVar1 == -1) {
      if (pAStack_18->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9PoPart(): There is no AIG.\n");
        return 1;
      }
      vPosEquivs = (Vec_Ptr_t *)
                   Gia_ManFindPoPartition
                             (pAStack_18->pGia,fSetLargest,fVerbose,local_48,local_4c,
                              (Vec_Ptr_t **)&SelectShift);
      if ((Gia_Man_t *)vPosEquivs != (Gia_Man_t *)0x0) {
        Abc_FrameUpdateGia(pAStack_18,(Gia_Man_t *)vPosEquivs);
      }
      Abc_FrameReplacePoEquivs(pAStack_18,(Vec_Ptr_t **)&SelectShift);
      return 0;
    }
    switch(iVar1) {
    case 0x53:
      if (argv_local._4_4_ <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-S\" should be followed by an integer.\n");
        goto LAB_002bb187;
      }
      fSetLargest = atoi((&pTemp->pName)[globalUtilOptind]);
      globalUtilOptind = globalUtilOptind + 1;
      if (fSetLargest < 0) {
LAB_002bb187:
        Abc_Print(-2,"usage: &popart [-S num] [-imvh]\n");
        Abc_Print(-2,"\t         partitioning of POs into equivalence classes\n");
        Abc_Print(-2,"\t-S num : random seed to select the set of pivot nodes [default = %d]\n",
                  (ulong)(uint)fSetLargest);
        Abc_Print(-2,"\t       : (if the seed is 0, the nodes with max fanout counts are used)\n");
        pcVar2 = "no";
        if (fVerbose != 0) {
          pcVar2 = "yes";
        }
        Abc_Print(-2,"\t-i     : toggle allowing only CIs to be the pivots [default = %s]\n",pcVar2)
        ;
        pcVar2 = "no";
        if (local_48 != 0) {
          pcVar2 = "yes";
        }
        Abc_Print(-2,
                  "\t-m     : toggle using the largest part as the current network [default = %s]\n"
                  ,pcVar2);
        pcVar2 = "no";
        if (local_4c != 0) {
          pcVar2 = "yes";
        }
        Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar2);
        Abc_Print(-2,"\t-h     : print the command usage\n");
        return 1;
      }
      break;
    default:
      goto LAB_002bb187;
    case 0x68:
      goto LAB_002bb187;
    case 0x69:
      fVerbose = fVerbose ^ 1;
      break;
    case 0x6d:
      local_48 = local_48 ^ 1;
      break;
    case 0x76:
      local_4c = local_4c ^ 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9PoPart( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Gia_Man_t * Gia_ManFindPoPartition( Gia_Man_t * p, int SelectShift, int fOnlyCis, int fSetLargest, int fVerbose, Vec_Ptr_t ** pvPosEquivs );
    Gia_Man_t * pTemp;
    Vec_Ptr_t * vPosEquivs = NULL;
    int c, SelectShift = 0, fOnlyCis = 0, fSetLargest = 0, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Simvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            SelectShift = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( SelectShift < 0 )
                goto usage;
            break;
        case 'i':
            fOnlyCis ^= 1;
            break;
        case 'm':
            fSetLargest ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9PoPart(): There is no AIG.\n" );
        return 1;
    }
    pTemp = Gia_ManFindPoPartition( pAbc->pGia, SelectShift, fOnlyCis, fSetLargest, fVerbose, &vPosEquivs );
    if ( pTemp )
        Abc_FrameUpdateGia( pAbc, pTemp );
    Abc_FrameReplacePoEquivs( pAbc, &vPosEquivs );
    return 0;

usage:
    Abc_Print( -2, "usage: &popart [-S num] [-imvh]\n" );
    Abc_Print( -2, "\t         partitioning of POs into equivalence classes\n" );
    Abc_Print( -2, "\t-S num : random seed to select the set of pivot nodes [default = %d]\n", SelectShift );
    Abc_Print( -2, "\t       : (if the seed is 0, the nodes with max fanout counts are used)\n" );
    Abc_Print( -2, "\t-i     : toggle allowing only CIs to be the pivots [default = %s]\n", fOnlyCis? "yes": "no" );
    Abc_Print( -2, "\t-m     : toggle using the largest part as the current network [default = %s]\n", fSetLargest? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}